

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunks.hpp
# Opt level: O3

iterator_range<burst::buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>_>
* __thiscall
burst::buffered_chunks_t::operator()
          (iterator_range<burst::buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>_>
           *__return_storage_ptr__,buffered_chunks_t *this,
          iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *args,
          int *args_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int> begin
  ;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  local_f0;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  local_b0;
  istream_type *local_70;
  int local_68;
  undefined1 local_64;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  *local_60;
  int local_58;
  undefined1 local_54;
  difference_type local_50;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  buffer_value_type *local_38;
  
  make_buffered_chunk_iterator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,int>
            (&local_f0,(burst *)args,
             (iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *)
             (ulong)(uint)*args_1,(int)args_1);
  local_b0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_b0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_40 = local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_70 = local_f0.m_current._M_stream;
  local_68 = local_f0.m_current._M_value;
  local_64 = local_f0.m_current._M_ok;
  local_60 = (buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
              *)local_f0.m_end._M_stream;
  local_58 = local_f0.m_end._M_value;
  local_54 = local_f0.m_end._M_ok;
  local_50 = local_f0.m_chunk_size;
  local_48 = local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = local_f0.m_chunk_end;
  local_b0.m_current._M_stream = local_f0.m_end._M_stream;
  local_b0.m_current._M_value = local_f0.m_end._M_value;
  local_b0.m_current._M_ok = local_f0.m_end._M_ok;
  local_b0.m_end._M_stream = local_f0.m_end._M_stream;
  local_b0.m_end._M_value = local_f0.m_end._M_value;
  local_b0.m_end._M_ok = local_f0.m_end._M_ok;
  local_b0.m_chunk_size = local_f0.m_chunk_size;
  local_b0.m_chunk_end = local_b0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  boost::
  make_iterator_range<burst::buffered_chunk_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,int>>
            (__return_storage_ptr__,(boost *)&local_70,&local_b0,
             (buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
              *)local_f0.m_end._M_stream);
  if (local_b0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_buffered_chunk_iterator(std::forward<Args>(args)...);
            auto end = make_buffered_chunk_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }